

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray * QBitArray::fromBits(char *data,qsizetype size)

{
  char *pcVar1;
  qsizetype qVar2;
  long in_RDX;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  QByteArray *d;
  QBitArray *result;
  QByteArray *in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffff98;
  QByteArray *in_stack_ffffffffffffffa0;
  
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QBitArray((QBitArray *)0x587dee);
  if (0 < in_RDX) {
    allocation_size((qsizetype)in_stack_ffffffffffffff90);
    QByteArray::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pcVar1 = QByteArray::data(in_stack_ffffffffffffff90);
    qVar2 = QByteArray::size(in_RDI);
    memcpy(pcVar1 + 1,in_RSI,qVar2 - 1);
    pcVar1 = QByteArray::data(in_RSI);
    qVar2 = QByteArray::size(in_RDI);
    adjust_head_and_tail(pcVar1,qVar2,in_RDX);
  }
  return (QBitArray *)in_RDI;
}

Assistant:

QBitArray QBitArray::fromBits(const char *data, qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::fromBits", "Size must be greater than or equal to 0.");
    QBitArray result;
    if (size <= 0)
        return result;

    auto &d = result.d;
    d.resize(allocation_size(size));
    memcpy(d.data() + 1, data, d.size() - 1);
    adjust_head_and_tail(d.data(), d.size(), size);
    return result;
}